

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor.h
# Opt level: O0

bool Fixpp::impl::
     doVisitField<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<124u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<32u,Fixpp::Type::Float>,Fixpp::TagT<17u,Fixpp::Type::String>,Fixpp::TagT<31u,Fixpp::Type::Float>,Fixpp::TagT<29u,Fixpp::Type::Char>>>,Fixpp::impl::FieldParser<Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<124u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<32u,Fixpp::Type::Float>,Fixpp::TagT<17u,Fixpp::Type::String>,Fixpp::TagT<31u,Fixpp::Type::Float>,Fixpp::TagT<29u,Fixpp::Type::Char>>>>::Visitor,0ul,1ul,2ul,3ul>
               (tuple<Fixpp::FieldRef<Fixpp::TagT<32U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<17U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<31U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<29U,_Fixpp::Type::Char>_>_>
                *message,uint tag,Visitor *visitor)

{
  uint uVar1;
  type_by_index_t<0UL,_Fixpp::FieldRef<Fixpp::TagT<32U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<17U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<31U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<29U,_Fixpp::Type::Char>_>_>
  *field;
  type_by_index_t<1UL,_Fixpp::FieldRef<Fixpp::TagT<32U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<17U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<31U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<29U,_Fixpp::Type::Char>_>_>
  *field_00;
  type_by_index_t<2UL,_Fixpp::FieldRef<Fixpp::TagT<32U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<17U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<31U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<29U,_Fixpp::Type::Char>_>_>
  *field_01;
  type_by_index_t<3UL,_Fixpp::FieldRef<Fixpp::TagT<32U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<17U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<31U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<29U,_Fixpp::Type::Char>_>_>
  *field_02;
  int dummy [5];
  int local_2c;
  Visitor *pVStack_28;
  int index;
  Visitor *visitor_local;
  tuple<Fixpp::FieldRef<Fixpp::TagT<32U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<17U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<31U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<29U,_Fixpp::Type::Char>_>_>
  *ptStack_18;
  uint tag_local;
  InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<124U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<32U,_Fixpp::Type::Float>,_Fixpp::TagT<17U,_Fixpp::Type::String>,_Fixpp::TagT<31U,_Fixpp::Type::Float>,_Fixpp::TagT<29U,_Fixpp::Type::Char>_>_>
  *message_local;
  
  local_2c = -1;
  pVStack_28 = visitor;
  visitor_local._4_4_ = tag;
  ptStack_18 = message;
  field = meta::
          get<0ul,Fixpp::FieldRef<Fixpp::TagT<32u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<17u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<31u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<29u,Fixpp::Type::Char>>>
                    (message);
  doVisitSingleField<0ul,Fixpp::FieldRef<Fixpp::TagT<32u,Fixpp::Type::Float>>,Fixpp::impl::FieldParser<Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<124u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<32u,Fixpp::Type::Float>,Fixpp::TagT<17u,Fixpp::Type::String>,Fixpp::TagT<31u,Fixpp::Type::Float>,Fixpp::TagT<29u,Fixpp::Type::Char>>>>::Visitor>
            (tag,field,pVStack_28,&local_2c);
  uVar1 = visitor_local._4_4_;
  field_00 = meta::
             get<1ul,Fixpp::FieldRef<Fixpp::TagT<32u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<17u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<31u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<29u,Fixpp::Type::Char>>>
                       (ptStack_18);
  doVisitSingleField<1ul,Fixpp::FieldRef<Fixpp::TagT<17u,Fixpp::Type::String>>,Fixpp::impl::FieldParser<Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<124u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<32u,Fixpp::Type::Float>,Fixpp::TagT<17u,Fixpp::Type::String>,Fixpp::TagT<31u,Fixpp::Type::Float>,Fixpp::TagT<29u,Fixpp::Type::Char>>>>::Visitor>
            (uVar1,field_00,pVStack_28,&local_2c);
  uVar1 = visitor_local._4_4_;
  field_01 = meta::
             get<2ul,Fixpp::FieldRef<Fixpp::TagT<32u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<17u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<31u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<29u,Fixpp::Type::Char>>>
                       (ptStack_18);
  doVisitSingleField<2ul,Fixpp::FieldRef<Fixpp::TagT<31u,Fixpp::Type::Float>>,Fixpp::impl::FieldParser<Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<124u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<32u,Fixpp::Type::Float>,Fixpp::TagT<17u,Fixpp::Type::String>,Fixpp::TagT<31u,Fixpp::Type::Float>,Fixpp::TagT<29u,Fixpp::Type::Char>>>>::Visitor>
            (uVar1,field_01,pVStack_28,&local_2c);
  uVar1 = visitor_local._4_4_;
  field_02 = meta::
             get<3ul,Fixpp::FieldRef<Fixpp::TagT<32u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<17u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<31u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<29u,Fixpp::Type::Char>>>
                       (ptStack_18);
  doVisitSingleField<3ul,Fixpp::FieldRef<Fixpp::TagT<29u,Fixpp::Type::Char>>,Fixpp::impl::FieldParser<Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<124u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<32u,Fixpp::Type::Float>,Fixpp::TagT<17u,Fixpp::Type::String>,Fixpp::TagT<31u,Fixpp::Type::Float>,Fixpp::TagT<29u,Fixpp::Type::Char>>>>::Visitor>
            (uVar1,field_02,pVStack_28,&local_2c);
  if (local_2c != -1) {
    std::bitset<4UL>::set
              ((bitset<4UL> *)
               &ptStack_18[1].base.
                super_tuple_value<0UL,_Fixpp::FieldRef<Fixpp::TagT<32U,_Fixpp::Type::Float>_>,_false>
                .value.m_view.second,(long)local_2c,true);
  }
  return local_2c != -1;
}

Assistant:

bool doVisitField(Message& message, unsigned tag, Visitor& visitor,
                          meta::seq::index_sequence<Indexes...>)
        {
            int index = -1;
            int dummy[] = {0, (doVisitSingleField<Indexes>(tag, meta::get<Indexes>(message.values), visitor, &index), 0)...};

            (void) dummy;
            (void) tag;
            (void) visitor;

            if (index != -1)
                message.allBits.set(static_cast<size_t>(index));

            return index != -1;
        }